

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::OutputFile::~OutputFile(OutputFile *this)

{
  long *plVar1;
  void *pvVar2;
  undefined8 uVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  OStream *unaff_retaddr;
  uint64_t originalPosition;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffb0;
  pointer puVar4;
  Data *in_stack_ffffffffffffffc0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *lineOffsets;
  
  (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__OutputFile_004eec00;
  if ((in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    lineOffsets = in_RDI;
    std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    uVar3 = (**(code **)(**(long **)((in_RDI->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_finish[0x27] + 0x28) +
                        0x18))();
    if ((in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish[0x20] != 0) {
      puVar4 = (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      plVar1 = *(long **)(puVar4[0x27] + 0x28);
      (**(code **)(*plVar1 + 0x20))(plVar1,puVar4[0x20]);
      anon_unknown_6::writeLineOffsets(unaff_retaddr,lineOffsets);
      plVar1 = *(long **)((in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_finish[0x27] + 0x28);
      (**(code **)(*plVar1 + 0x20))(plVar1,uVar3);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x15c4a8);
    if (((((in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish[0x28] & 1) != 0) &&
        ((in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_finish[0x27] != 0)) &&
       (in_stack_ffffffffffffffc0 =
             *(Data **)((in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data._M_finish[0x27] + 0x28),
       in_stack_ffffffffffffffc0 != (Data *)0x0)) {
      (**(code **)(*(long *)&(in_stack_ffffffffffffffc0->header)._map._M_t._M_impl + 8))();
    }
    if ((((int)(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish[0x26] == -1) &&
        ((in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_finish[0x27] != 0)) &&
       (pvVar2 = (void *)(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data._M_finish[0x27], pvVar2 != (void *)0x0)) {
      operator_delete(pvVar2,0x38);
    }
    puVar4 = (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar4 != (pointer)0x0) {
      Data::~Data(in_stack_ffffffffffffffc0);
      operator_delete(puVar4,0x148);
    }
  }
  GenericOutputFile::~GenericOutputFile((GenericOutputFile *)in_RDI);
  return;
}

Assistant:

OutputFile::~OutputFile ()
{
    if (_data)
    {
        {
#if ILMTHREAD_THREADING_ENABLED
            std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
            uint64_t originalPosition = _data->_streamData->os->tellp ();

            if (_data->lineOffsetsPosition > 0)
            {
                try
                {
                    _data->_streamData->os->seekp (_data->lineOffsetsPosition);
                    writeLineOffsets (
                        *_data->_streamData->os, _data->lineOffsets);

                    //
                    // Restore the original position.
                    //
                    _data->_streamData->os->seekp (originalPosition);
                }
                catch (
                    ...) //NOSONAR - suppress vulnerability reports from SonarCloud.
                {
                    //
                    // We cannot safely throw any exceptions from here.
                    // This destructor may have been called because the
                    // stack is currently being unwound for another
                    // exception.
                    //
                }
            }
        }

        if (_data->_deleteStream && _data->_streamData)
            delete _data->_streamData->os;

        if (_data->partNumber == -1 && _data->_streamData)
            delete _data->_streamData;

        delete _data;
    }
}